

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx::BVHNIntersector1<4,_1,_true,_embree::avx::SubdivPatch1Intersector1>::occluded
               (Intersectors *This,Ray *ray,RayQueryContext *context)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  Geometry *pGVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  uint uVar50;
  undefined4 uVar51;
  ulong uVar52;
  ulong uVar53;
  long lVar54;
  ulong uVar55;
  ulong uVar56;
  undefined1 (*pauVar57) [16];
  ulong uVar58;
  long lVar59;
  ulong uVar60;
  ulong uVar61;
  float fVar62;
  float fVar63;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar84 [32];
  float fVar88;
  float fVar92;
  undefined1 auVar86 [32];
  float fVar89;
  float fVar90;
  float fVar91;
  undefined1 auVar87 [64];
  float fVar93;
  float fVar99;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  float fVar97;
  float fVar98;
  float fVar100;
  float fVar101;
  float fVar102;
  undefined1 auVar96 [64];
  float fVar113;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [32];
  float fVar114;
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  float fVar115;
  float fVar116;
  float fVar117;
  undefined1 auVar112 [64];
  float fVar118;
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  undefined1 auVar121 [64];
  undefined1 auVar128 [16];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [64];
  float fVar132;
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  undefined1 auVar137 [64];
  float fVar144;
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  undefined1 auVar147 [64];
  float fVar154;
  float fVar155;
  undefined1 auVar158 [32];
  float fVar163;
  undefined1 auVar160 [32];
  float fVar162;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  undefined1 auVar161 [64];
  float fVar169;
  float fVar174;
  undefined1 auVar170 [16];
  float fVar172;
  float fVar173;
  float fVar175;
  float fVar176;
  float fVar177;
  undefined1 auVar171 [64];
  float fVar178;
  undefined1 auVar179 [32];
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  undefined1 auVar180 [64];
  float fVar187;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  undefined1 auVar188 [64];
  float fVar195;
  float fVar196;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  undefined1 auVar197 [32];
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  MapUV<embree::avx::GridSOA::Gather3x3> mapUV;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  int local_c7c;
  Ray *local_c78;
  undefined1 local_c70 [16];
  undefined1 local_c60 [16];
  undefined1 (*local_c50) [16];
  ulong local_c48;
  ulong local_c40;
  ulong *local_c38;
  RayQueryContext *local_c30;
  long local_c28;
  undefined1 local_c20 [32];
  undefined4 local_c00;
  undefined4 local_bfc;
  undefined4 local_bf8;
  undefined4 local_bf4;
  undefined4 local_bf0;
  undefined4 local_bec;
  undefined4 local_be8;
  uint local_be4;
  uint local_be0;
  int *local_bd0;
  undefined8 local_bc8;
  RTCRayQueryContext *local_bc0;
  Ray *local_bb8;
  undefined4 *local_bb0;
  undefined4 local_ba8;
  float local_ba0;
  float fStack_b9c;
  float fStack_b98;
  float fStack_b94;
  float fStack_b90;
  float fStack_b8c;
  float fStack_b88;
  float fStack_b84;
  undefined1 local_b70 [16];
  undefined1 local_b60 [16];
  undefined1 local_b50 [16];
  undefined1 local_b40 [16];
  undefined1 local_b30 [16];
  undefined1 local_b20 [16];
  undefined1 local_b10 [16];
  undefined1 local_b00 [16];
  undefined1 local_af0 [16];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  float local_9c0;
  float fStack_9bc;
  float fStack_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  float fStack_9a8;
  float fStack_9a4;
  undefined1 local_9a0 [32];
  float local_980;
  float fStack_97c;
  float fStack_978;
  float fStack_974;
  float fStack_970;
  float fStack_96c;
  float fStack_968;
  float fStack_964;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined1 (**local_900) [16];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  ulong local_800 [250];
  undefined1 auVar83 [24];
  undefined1 auVar85 [32];
  undefined1 auVar156 [16];
  undefined1 auVar157 [24];
  undefined1 auVar159 [32];
  
  local_800[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_800[0] != 8) {
    fVar62 = ray->tfar;
    if (0.0 <= fVar62) {
      local_c38 = local_800 + 1;
      aVar1 = (ray->dir).field_0;
      auVar128 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar94._8_4_ = 0x7fffffff;
      auVar94._0_8_ = 0x7fffffff7fffffff;
      auVar94._12_4_ = 0x7fffffff;
      auVar94 = vandps_avx((undefined1  [16])aVar1,auVar94);
      auVar95._8_4_ = 0x219392ef;
      auVar95._0_8_ = 0x219392ef219392ef;
      auVar95._12_4_ = 0x219392ef;
      auVar94 = vcmpps_avx(auVar94,auVar95,1);
      auVar103._8_4_ = 0x3f800000;
      auVar103._0_8_ = 0x3f8000003f800000;
      auVar103._12_4_ = 0x3f800000;
      auVar95 = vdivps_avx(auVar103,(undefined1  [16])aVar1);
      auVar104._8_4_ = 0x5d5e0b6b;
      auVar104._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar104._12_4_ = 0x5d5e0b6b;
      auVar94 = vblendvps_avx(auVar95,auVar104,auVar94);
      auVar170._0_4_ = auVar94._0_4_ * 0.99999964;
      auVar170._4_4_ = auVar94._4_4_ * 0.99999964;
      auVar170._8_4_ = auVar94._8_4_ * 0.99999964;
      auVar170._12_4_ = auVar94._12_4_ * 0.99999964;
      auVar81._0_4_ = auVar94._0_4_ * 1.0000004;
      auVar81._4_4_ = auVar94._4_4_ * 1.0000004;
      auVar81._8_4_ = auVar94._8_4_ * 1.0000004;
      auVar81._12_4_ = auVar94._12_4_ * 1.0000004;
      uVar51 = *(undefined4 *)&(ray->org).field_0;
      local_af0._4_4_ = uVar51;
      local_af0._0_4_ = uVar51;
      local_af0._8_4_ = uVar51;
      local_af0._12_4_ = uVar51;
      auVar131 = ZEXT1664(local_af0);
      uVar51 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_b00._4_4_ = uVar51;
      local_b00._0_4_ = uVar51;
      local_b00._8_4_ = uVar51;
      local_b00._12_4_ = uVar51;
      auVar137 = ZEXT1664(local_b00);
      uVar51 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_b10._4_4_ = uVar51;
      local_b10._0_4_ = uVar51;
      local_b10._8_4_ = uVar51;
      local_b10._12_4_ = uVar51;
      auVar147 = ZEXT1664(local_b10);
      local_b20 = vshufps_avx(auVar170,auVar170,0);
      auVar161 = ZEXT1664(local_b20);
      auVar94 = vmovshdup_avx(auVar170);
      local_b30 = vshufps_avx(auVar170,auVar170,0x55);
      auVar171 = ZEXT1664(local_b30);
      auVar95 = vshufpd_avx(auVar170,auVar170,1);
      local_b40 = vshufps_avx(auVar170,auVar170,0xaa);
      auVar96 = ZEXT1664(local_b40);
      local_c60 = vshufps_avx(auVar81,auVar81,0);
      auVar180 = ZEXT1664(local_c60);
      local_c70 = vshufps_avx(auVar81,auVar81,0x55);
      auVar188 = ZEXT1664(local_c70);
      uVar58 = (ulong)(auVar170._0_4_ < 0.0) * 0x10;
      uVar60 = (ulong)(auVar94._0_4_ < 0.0) << 4 | 0x20;
      local_b50 = vshufps_avx(auVar81,auVar81,0xaa);
      auVar87 = ZEXT1664(local_b50);
      uVar61 = (ulong)(auVar95._0_4_ < 0.0) << 4 | 0x40;
      local_b60 = vshufps_avx(auVar128,auVar128,0);
      auVar112 = ZEXT1664(local_b60);
      local_b70 = vshufps_avx(ZEXT416((uint)fVar62),ZEXT416((uint)fVar62),0);
      auVar121 = ZEXT1664(local_b70);
      local_a20._16_16_ = mm_lookupmask_ps._240_16_;
      local_a20._0_16_ = mm_lookupmask_ps._240_16_;
      uVar55 = 0;
      local_c30 = context;
      local_c78 = ray;
      do {
        local_c28 = uVar55 + 0x30;
LAB_00b80109:
        if (local_c38 == local_800) {
          return;
        }
        uVar56 = local_c38[-1];
        local_c38 = local_c38 + -1;
        while ((uVar56 & 8) == 0) {
          auVar94 = vsubps_avx(*(undefined1 (*) [16])(uVar56 + 0x20 + uVar58),auVar131._0_16_);
          auVar128._0_4_ = auVar161._0_4_ * auVar94._0_4_;
          auVar128._4_4_ = auVar161._4_4_ * auVar94._4_4_;
          auVar128._8_4_ = auVar161._8_4_ * auVar94._8_4_;
          auVar128._12_4_ = auVar161._12_4_ * auVar94._12_4_;
          auVar94 = vsubps_avx(*(undefined1 (*) [16])(uVar56 + 0x20 + uVar60),auVar137._0_16_);
          auVar72._0_4_ = auVar171._0_4_ * auVar94._0_4_;
          auVar72._4_4_ = auVar171._4_4_ * auVar94._4_4_;
          auVar72._8_4_ = auVar171._8_4_ * auVar94._8_4_;
          auVar72._12_4_ = auVar171._12_4_ * auVar94._12_4_;
          auVar94 = vmaxps_avx(auVar128,auVar72);
          auVar95 = vsubps_avx(*(undefined1 (*) [16])(uVar56 + 0x20 + uVar61),auVar147._0_16_);
          auVar73._0_4_ = auVar96._0_4_ * auVar95._0_4_;
          auVar73._4_4_ = auVar96._4_4_ * auVar95._4_4_;
          auVar73._8_4_ = auVar96._8_4_ * auVar95._8_4_;
          auVar73._12_4_ = auVar96._12_4_ * auVar95._12_4_;
          auVar95 = vmaxps_avx(auVar73,auVar112._0_16_);
          auVar94 = vmaxps_avx(auVar94,auVar95);
          auVar95 = vsubps_avx(*(undefined1 (*) [16])(uVar56 + 0x20 + (uVar58 ^ 0x10)),
                               auVar131._0_16_);
          auVar74._0_4_ = auVar180._0_4_ * auVar95._0_4_;
          auVar74._4_4_ = auVar180._4_4_ * auVar95._4_4_;
          auVar74._8_4_ = auVar180._8_4_ * auVar95._8_4_;
          auVar74._12_4_ = auVar180._12_4_ * auVar95._12_4_;
          auVar95 = vsubps_avx(*(undefined1 (*) [16])(uVar56 + 0x20 + (uVar60 ^ 0x10)),
                               auVar137._0_16_);
          auVar77._0_4_ = auVar188._0_4_ * auVar95._0_4_;
          auVar77._4_4_ = auVar188._4_4_ * auVar95._4_4_;
          auVar77._8_4_ = auVar188._8_4_ * auVar95._8_4_;
          auVar77._12_4_ = auVar188._12_4_ * auVar95._12_4_;
          auVar95 = vminps_avx(auVar74,auVar77);
          auVar128 = vsubps_avx(*(undefined1 (*) [16])(uVar56 + 0x20 + (uVar61 ^ 0x10)),
                                auVar147._0_16_);
          auVar78._0_4_ = auVar87._0_4_ * auVar128._0_4_;
          auVar78._4_4_ = auVar87._4_4_ * auVar128._4_4_;
          auVar78._8_4_ = auVar87._8_4_ * auVar128._8_4_;
          auVar78._12_4_ = auVar87._12_4_ * auVar128._12_4_;
          auVar128 = vminps_avx(auVar78,auVar121._0_16_);
          auVar95 = vminps_avx(auVar95,auVar128);
          auVar94 = vcmpps_avx(auVar94,auVar95,2);
          uVar50 = vmovmskps_avx(auVar94);
          if (uVar50 == 0) goto LAB_00b80109;
          uVar50 = uVar50 & 0xff;
          uVar52 = uVar56 & 0xfffffffffffffff0;
          lVar54 = 0;
          if (uVar50 != 0) {
            for (; (uVar50 >> lVar54 & 1) == 0; lVar54 = lVar54 + 1) {
            }
          }
          uVar56 = *(ulong *)(uVar52 + lVar54 * 8);
          uVar50 = uVar50 - 1 & uVar50;
          uVar53 = (ulong)uVar50;
          if (uVar50 != 0) {
            do {
              *local_c38 = uVar56;
              local_c38 = local_c38 + 1;
              lVar54 = 0;
              if (uVar53 != 0) {
                for (; (uVar53 >> lVar54 & 1) == 0; lVar54 = lVar54 + 1) {
                }
              }
              uVar56 = *(ulong *)(uVar52 + lVar54 * 8);
              uVar53 = uVar53 - 1 & uVar53;
            } while (uVar53 != 0);
          }
        }
        if (((uint)uVar56 & 0xf) == 8) {
          uVar50 = *(uint *)(uVar55 + 0xc);
          local_c48 = (ulong)uVar50;
          uVar3 = *(uint *)(uVar55 + 0x10);
          local_c40 = (ulong)uVar3;
          lVar59 = (ulong)*(uint *)(uVar55 + 0x24) + local_c28;
          uVar56 = uVar56 >> 4;
          lVar54 = lVar59 + uVar56 * 4;
          auVar94 = *(undefined1 (*) [16])(lVar54 + -4 + local_c48 * 4);
          auVar95 = auVar94;
          if (2 < local_c40) {
            auVar95 = *(undefined1 (*) [16])(lVar59 + uVar56 * 4 + -4 + local_c48 * 8);
          }
          auVar128 = *(undefined1 (*) [16])(lVar59 + -4 + uVar56 * 4);
          if (local_c48 == 2) {
            auVar128 = vshufps_avx(auVar128,auVar128,0x54);
            auVar94 = vshufps_avx(auVar94,auVar94,0x54);
            auVar95 = vshufps_avx(auVar95,auVar95,0x54);
          }
          uVar56 = (ulong)*(uint *)(uVar55 + 0x14);
          pauVar57 = (undefined1 (*) [16])(lVar54 + uVar56 * 4 + -4);
          auVar81 = *(undefined1 (*) [16])(*pauVar57 + local_c48 * 4);
          auVar170 = auVar81;
          if (2 < uVar3) {
            auVar170 = *(undefined1 (*) [16])(*pauVar57 + local_c48 * 8);
          }
          auVar103 = *pauVar57;
          if (uVar50 == 2) {
            auVar103 = vshufps_avx(auVar103,auVar103,0x54);
            auVar81 = vshufps_avx(auVar81,auVar81,0x54);
            auVar170 = vshufps_avx(auVar170,auVar170,0x54);
          }
          pauVar57 = (undefined1 (*) [16])(lVar54 + uVar56 * 8 + -4);
          auVar104 = *(undefined1 (*) [16])(*pauVar57 + local_c48 * 4);
          auVar72 = auVar104;
          if (2 < uVar3) {
            auVar72 = *(undefined1 (*) [16])(*pauVar57 + local_c48 * 8);
          }
          auVar133._16_16_ = auVar94;
          auVar133._0_16_ = auVar128;
          auVar64._16_16_ = auVar95;
          auVar64._0_16_ = auVar94;
          auVar18 = vunpcklps_avx(auVar133,auVar64);
          auVar133 = vshufps_avx(auVar133,auVar133,0xa5);
          auVar64 = vshufps_avx(auVar64,auVar64,0x94);
          auVar129._16_16_ = auVar81;
          auVar129._0_16_ = auVar103;
          auVar84._16_16_ = auVar170;
          auVar84._0_16_ = auVar81;
          auVar19 = vunpcklps_avx(auVar129,auVar84);
          auVar129 = vshufps_avx(auVar129,auVar129,0xa5);
          auVar84 = vshufps_avx(auVar84,auVar84,0x94);
          auVar94 = *pauVar57;
          if (uVar50 == 2) {
            auVar94 = vshufps_avx(auVar94,auVar94,0x54);
            auVar104 = vshufps_avx(auVar104,auVar104,0x54);
            auVar72 = vshufps_avx(auVar72,auVar72,0x54);
          }
          auVar134._16_16_ = auVar104;
          auVar134._0_16_ = auVar94;
          auVar105._16_16_ = auVar72;
          auVar105._0_16_ = auVar104;
          auVar20 = vunpcklps_avx(auVar134,auVar105);
          auVar15 = vshufps_avx(auVar134,auVar134,0xa5);
          uVar51 = *(undefined4 *)&(local_c78->org).field_0;
          auVar145._4_4_ = uVar51;
          auVar145._0_4_ = uVar51;
          auVar145._8_4_ = uVar51;
          auVar145._12_4_ = uVar51;
          auVar145._16_4_ = uVar51;
          auVar145._20_4_ = uVar51;
          auVar145._24_4_ = uVar51;
          auVar145._28_4_ = uVar51;
          uVar51 = *(undefined4 *)((long)&(local_c78->org).field_0 + 4);
          auVar158._4_4_ = uVar51;
          auVar158._0_4_ = uVar51;
          auVar158._8_4_ = uVar51;
          auVar158._12_4_ = uVar51;
          auVar158._16_4_ = uVar51;
          auVar158._20_4_ = uVar51;
          auVar158._24_4_ = uVar51;
          auVar158._28_4_ = uVar51;
          auVar16 = vshufps_avx(auVar105,auVar105,0x94);
          uVar51 = *(undefined4 *)((long)&(local_c78->org).field_0 + 8);
          auVar179._4_4_ = uVar51;
          auVar179._0_4_ = uVar51;
          auVar179._8_4_ = uVar51;
          auVar179._12_4_ = uVar51;
          auVar179._16_4_ = uVar51;
          auVar179._20_4_ = uVar51;
          auVar179._24_4_ = uVar51;
          auVar179._28_4_ = uVar51;
          local_ac0 = vsubps_avx(auVar18,auVar145);
          local_ae0 = vsubps_avx(auVar19,auVar158);
          local_a40 = vsubps_avx(auVar20,auVar179);
          auVar133 = vsubps_avx(auVar133,auVar145);
          auVar129 = vsubps_avx(auVar129,auVar158);
          auVar18 = vsubps_avx(auVar15,auVar179);
          auVar64 = vsubps_avx(auVar64,auVar145);
          auVar84 = vsubps_avx(auVar84,auVar158);
          auVar19 = vsubps_avx(auVar16,auVar179);
          local_a60 = vsubps_avx(auVar64,local_ac0);
          local_a80 = vsubps_avx(auVar84,local_ae0);
          local_9a0 = vsubps_avx(auVar19,local_a40);
          fVar5 = local_ae0._0_4_;
          fVar62 = auVar84._0_4_ + fVar5;
          fVar7 = local_ae0._4_4_;
          fVar66 = auVar84._4_4_ + fVar7;
          fVar9 = local_ae0._8_4_;
          fVar67 = auVar84._8_4_ + fVar9;
          fVar88 = local_ae0._12_4_;
          fVar68 = auVar84._12_4_ + fVar88;
          fVar90 = local_ae0._16_4_;
          fVar69 = auVar84._16_4_ + fVar90;
          fVar92 = local_ae0._20_4_;
          fVar70 = auVar84._20_4_ + fVar92;
          fVar12 = local_ae0._24_4_;
          fVar71 = auVar84._24_4_ + fVar12;
          fVar63 = local_ae0._28_4_;
          fVar195 = local_a40._0_4_;
          fVar144 = fVar195 + auVar19._0_4_;
          fVar198 = local_a40._4_4_;
          fVar148 = fVar198 + auVar19._4_4_;
          fVar200 = local_a40._8_4_;
          fVar149 = fVar200 + auVar19._8_4_;
          fVar202 = local_a40._12_4_;
          fVar150 = fVar202 + auVar19._12_4_;
          fVar204 = local_a40._16_4_;
          fVar151 = fVar204 + auVar19._16_4_;
          fVar206 = local_a40._20_4_;
          fVar152 = fVar206 + auVar19._20_4_;
          fVar208 = local_a40._24_4_;
          fVar153 = fVar208 + auVar19._24_4_;
          fVar113 = local_a40._28_4_;
          fVar93 = local_9a0._0_4_;
          fVar97 = local_9a0._4_4_;
          auVar15._4_4_ = fVar97 * fVar66;
          auVar15._0_4_ = fVar93 * fVar62;
          fVar98 = local_9a0._8_4_;
          auVar15._8_4_ = fVar98 * fVar67;
          fVar99 = local_9a0._12_4_;
          auVar15._12_4_ = fVar99 * fVar68;
          fVar100 = local_9a0._16_4_;
          auVar15._16_4_ = fVar100 * fVar69;
          fVar101 = local_9a0._20_4_;
          auVar15._20_4_ = fVar101 * fVar70;
          fVar102 = local_9a0._24_4_;
          auVar15._24_4_ = fVar102 * fVar71;
          auVar15._28_4_ = auVar16._28_4_;
          fVar154 = local_a80._0_4_;
          fVar162 = local_a80._4_4_;
          auVar16._4_4_ = fVar162 * fVar148;
          auVar16._0_4_ = fVar154 * fVar144;
          fVar164 = local_a80._8_4_;
          auVar16._8_4_ = fVar164 * fVar149;
          fVar165 = local_a80._12_4_;
          auVar16._12_4_ = fVar165 * fVar150;
          fVar166 = local_a80._16_4_;
          auVar16._16_4_ = fVar166 * fVar151;
          fVar167 = local_a80._20_4_;
          auVar16._20_4_ = fVar167 * fVar152;
          fVar168 = local_a80._24_4_;
          auVar16._24_4_ = fVar168 * fVar153;
          auVar16._28_4_ = uVar51;
          auVar15 = vsubps_avx(auVar16,auVar15);
          fVar6 = local_ac0._0_4_;
          fVar169 = auVar64._0_4_ + fVar6;
          fVar8 = local_ac0._4_4_;
          fVar172 = auVar64._4_4_ + fVar8;
          fVar10 = local_ac0._8_4_;
          fVar173 = auVar64._8_4_ + fVar10;
          fVar89 = local_ac0._12_4_;
          fVar174 = auVar64._12_4_ + fVar89;
          fVar91 = local_ac0._16_4_;
          fVar175 = auVar64._16_4_ + fVar91;
          fVar11 = local_ac0._20_4_;
          fVar176 = auVar64._20_4_ + fVar11;
          fVar13 = local_ac0._24_4_;
          fVar177 = auVar64._24_4_ + fVar13;
          fVar132 = local_a60._0_4_;
          fVar138 = local_a60._4_4_;
          auVar20._4_4_ = fVar138 * fVar148;
          auVar20._0_4_ = fVar132 * fVar144;
          fVar139 = local_a60._8_4_;
          auVar20._8_4_ = fVar139 * fVar149;
          fVar140 = local_a60._12_4_;
          auVar20._12_4_ = fVar140 * fVar150;
          fVar141 = local_a60._16_4_;
          auVar20._16_4_ = fVar141 * fVar151;
          fVar142 = local_a60._20_4_;
          auVar20._20_4_ = fVar142 * fVar152;
          fVar143 = local_a60._24_4_;
          auVar20._24_4_ = fVar143 * fVar153;
          auVar20._28_4_ = fVar113 + auVar19._28_4_;
          auVar105 = local_9a0;
          auVar14._4_4_ = fVar172 * fVar97;
          auVar14._0_4_ = fVar169 * fVar93;
          auVar14._8_4_ = fVar173 * fVar98;
          auVar14._12_4_ = fVar174 * fVar99;
          auVar14._16_4_ = fVar175 * fVar100;
          auVar14._20_4_ = fVar176 * fVar101;
          auVar14._24_4_ = fVar177 * fVar102;
          auVar14._28_4_ = uVar51;
          auVar16 = vsubps_avx(auVar14,auVar20);
          auVar17._4_4_ = fVar162 * fVar172;
          auVar17._0_4_ = fVar154 * fVar169;
          auVar17._8_4_ = fVar164 * fVar173;
          auVar17._12_4_ = fVar165 * fVar174;
          auVar17._16_4_ = fVar166 * fVar175;
          auVar17._20_4_ = fVar167 * fVar176;
          auVar17._24_4_ = fVar168 * fVar177;
          auVar17._28_4_ = auVar64._28_4_ + local_ac0._28_4_;
          auVar21._4_4_ = fVar138 * fVar66;
          auVar21._0_4_ = fVar132 * fVar62;
          auVar21._8_4_ = fVar139 * fVar67;
          auVar21._12_4_ = fVar140 * fVar68;
          auVar21._16_4_ = fVar141 * fVar69;
          auVar21._20_4_ = fVar142 * fVar70;
          auVar21._24_4_ = fVar143 * fVar71;
          auVar21._28_4_ = auVar84._28_4_ + fVar63;
          local_980 = (local_c78->dir).field_0.m128[2];
          auVar20 = vsubps_avx(auVar21,auVar17);
          local_9c0 = (local_c78->dir).field_0.m128[1];
          fVar62 = (local_c78->dir).field_0.m128[0];
          local_ba0 = auVar15._0_4_ * fVar62 + local_9c0 * auVar16._0_4_ + local_980 * auVar20._0_4_
          ;
          fStack_b9c = auVar15._4_4_ * fVar62 +
                       local_9c0 * auVar16._4_4_ + local_980 * auVar20._4_4_;
          fStack_b98 = auVar15._8_4_ * fVar62 +
                       local_9c0 * auVar16._8_4_ + local_980 * auVar20._8_4_;
          fStack_b94 = auVar15._12_4_ * fVar62 +
                       local_9c0 * auVar16._12_4_ + local_980 * auVar20._12_4_;
          fStack_b90 = auVar15._16_4_ * fVar62 +
                       local_9c0 * auVar16._16_4_ + local_980 * auVar20._16_4_;
          fStack_b8c = auVar15._20_4_ * fVar62 +
                       local_9c0 * auVar16._20_4_ + local_980 * auVar20._20_4_;
          fStack_b88 = auVar15._24_4_ * fVar62 +
                       local_9c0 * auVar16._24_4_ + local_980 * auVar20._24_4_;
          fStack_b84 = auVar15._28_4_ + auVar16._28_4_ + auVar20._28_4_;
          auVar15 = vsubps_avx(local_ae0,auVar129);
          auVar16 = vsubps_avx(local_a40,auVar18);
          fVar69 = fVar5 + auVar129._0_4_;
          fVar70 = fVar7 + auVar129._4_4_;
          fVar71 = fVar9 + auVar129._8_4_;
          fVar144 = fVar88 + auVar129._12_4_;
          fVar148 = fVar90 + auVar129._16_4_;
          fVar149 = fVar92 + auVar129._20_4_;
          fVar150 = fVar12 + auVar129._24_4_;
          fVar66 = auVar129._28_4_;
          fVar68 = fVar195 + auVar18._0_4_;
          fVar151 = fVar198 + auVar18._4_4_;
          fVar152 = fVar200 + auVar18._8_4_;
          fVar153 = fVar202 + auVar18._12_4_;
          fVar169 = fVar204 + auVar18._16_4_;
          fVar172 = fVar206 + auVar18._20_4_;
          fVar173 = fVar208 + auVar18._24_4_;
          fVar67 = auVar18._28_4_;
          fVar210 = auVar16._0_4_;
          fVar211 = auVar16._4_4_;
          auVar22._4_4_ = fVar211 * fVar70;
          auVar22._0_4_ = fVar210 * fVar69;
          fVar212 = auVar16._8_4_;
          auVar22._8_4_ = fVar212 * fVar71;
          fVar213 = auVar16._12_4_;
          auVar22._12_4_ = fVar213 * fVar144;
          fVar214 = auVar16._16_4_;
          auVar22._16_4_ = fVar214 * fVar148;
          fVar215 = auVar16._20_4_;
          auVar22._20_4_ = fVar215 * fVar149;
          fVar216 = auVar16._24_4_;
          auVar22._24_4_ = fVar216 * fVar150;
          auVar22._28_4_ = fVar113;
          fVar187 = auVar15._0_4_;
          fVar189 = auVar15._4_4_;
          auVar23._4_4_ = fVar189 * fVar151;
          auVar23._0_4_ = fVar187 * fVar68;
          fVar190 = auVar15._8_4_;
          auVar23._8_4_ = fVar190 * fVar152;
          fVar191 = auVar15._12_4_;
          auVar23._12_4_ = fVar191 * fVar153;
          fVar192 = auVar15._16_4_;
          auVar23._16_4_ = fVar192 * fVar169;
          fVar193 = auVar15._20_4_;
          auVar23._20_4_ = fVar193 * fVar172;
          fVar194 = auVar15._24_4_;
          auVar23._24_4_ = fVar194 * fVar173;
          auVar23._28_4_ = fVar63;
          auVar15 = vsubps_avx(auVar23,auVar22);
          auVar16 = vsubps_avx(local_ac0,auVar133);
          fVar196 = auVar16._0_4_;
          fVar199 = auVar16._4_4_;
          auVar24._4_4_ = fVar199 * fVar151;
          auVar24._0_4_ = fVar196 * fVar68;
          fVar201 = auVar16._8_4_;
          auVar24._8_4_ = fVar201 * fVar152;
          fVar203 = auVar16._12_4_;
          auVar24._12_4_ = fVar203 * fVar153;
          fVar205 = auVar16._16_4_;
          auVar24._16_4_ = fVar205 * fVar169;
          fVar207 = auVar16._20_4_;
          auVar24._20_4_ = fVar207 * fVar172;
          fVar209 = auVar16._24_4_;
          auVar24._24_4_ = fVar209 * fVar173;
          auVar24._28_4_ = fVar113 + fVar67;
          fVar151 = auVar133._0_4_ + fVar6;
          fVar152 = auVar133._4_4_ + fVar8;
          fVar153 = auVar133._8_4_ + fVar10;
          fVar169 = auVar133._12_4_ + fVar89;
          fVar172 = auVar133._16_4_ + fVar91;
          fVar173 = auVar133._20_4_ + fVar11;
          fVar174 = auVar133._24_4_ + fVar13;
          auVar25._4_4_ = fVar211 * fVar152;
          auVar25._0_4_ = fVar210 * fVar151;
          auVar25._8_4_ = fVar212 * fVar153;
          auVar25._12_4_ = fVar213 * fVar169;
          auVar25._16_4_ = fVar214 * fVar172;
          auVar25._20_4_ = fVar215 * fVar173;
          fVar68 = auVar133._28_4_;
          auVar25._24_4_ = fVar216 * fVar174;
          auVar25._28_4_ = fVar68;
          auVar16 = vsubps_avx(auVar25,auVar24);
          auVar26._4_4_ = fVar189 * fVar152;
          auVar26._0_4_ = fVar187 * fVar151;
          auVar26._8_4_ = fVar190 * fVar153;
          auVar26._12_4_ = fVar191 * fVar169;
          auVar26._16_4_ = fVar192 * fVar172;
          auVar26._20_4_ = fVar193 * fVar173;
          auVar26._24_4_ = fVar194 * fVar174;
          auVar26._28_4_ = fVar68;
          auVar27._4_4_ = fVar199 * fVar70;
          auVar27._0_4_ = fVar196 * fVar69;
          auVar27._8_4_ = fVar201 * fVar71;
          auVar27._12_4_ = fVar203 * fVar144;
          auVar27._16_4_ = fVar205 * fVar148;
          auVar27._20_4_ = fVar207 * fVar149;
          auVar27._24_4_ = fVar209 * fVar150;
          auVar27._28_4_ = fVar63 + fVar66;
          auVar20 = vsubps_avx(auVar27,auVar26);
          auVar49._4_4_ = fStack_b9c;
          auVar49._0_4_ = local_ba0;
          auVar49._8_4_ = fStack_b98;
          auVar49._12_4_ = fStack_b94;
          auVar49._16_4_ = fStack_b90;
          auVar49._20_4_ = fStack_b8c;
          auVar49._24_4_ = fStack_b88;
          auVar49._28_4_ = fStack_b84;
          fVar155 = fVar62 * auVar15._0_4_ + local_9c0 * auVar16._0_4_ + local_980 * auVar20._0_4_;
          fVar163 = fVar62 * auVar15._4_4_ + local_9c0 * auVar16._4_4_ + local_980 * auVar20._4_4_;
          auVar156._0_8_ = CONCAT44(fVar163,fVar155);
          auVar156._8_4_ =
               fVar62 * auVar15._8_4_ + local_9c0 * auVar16._8_4_ + local_980 * auVar20._8_4_;
          auVar156._12_4_ =
               fVar62 * auVar15._12_4_ + local_9c0 * auVar16._12_4_ + local_980 * auVar20._12_4_;
          auVar157._16_4_ =
               fVar62 * auVar15._16_4_ + local_9c0 * auVar16._16_4_ + local_980 * auVar20._16_4_;
          auVar157._0_16_ = auVar156;
          auVar157._20_4_ =
               fVar62 * auVar15._20_4_ + local_9c0 * auVar16._20_4_ + local_980 * auVar20._20_4_;
          auVar159._24_4_ =
               fVar62 * auVar15._24_4_ + local_9c0 * auVar16._24_4_ + local_980 * auVar20._24_4_;
          auVar159._0_24_ = auVar157;
          auVar159._28_4_ = auVar15._28_4_ + auVar16._28_4_ + auVar20._28_4_;
          auVar15 = vsubps_avx(auVar133,auVar64);
          fVar176 = auVar133._0_4_ + auVar64._0_4_;
          fVar177 = auVar133._4_4_ + auVar64._4_4_;
          fVar113 = auVar133._8_4_ + auVar64._8_4_;
          fVar114 = auVar133._12_4_ + auVar64._12_4_;
          fVar115 = auVar133._16_4_ + auVar64._16_4_;
          fVar116 = auVar133._20_4_ + auVar64._20_4_;
          fVar117 = auVar133._24_4_ + auVar64._24_4_;
          auVar133 = vsubps_avx(auVar129,auVar84);
          fVar152 = auVar129._0_4_ + auVar84._0_4_;
          fVar153 = auVar129._4_4_ + auVar84._4_4_;
          fVar169 = auVar129._8_4_ + auVar84._8_4_;
          fVar172 = auVar129._12_4_ + auVar84._12_4_;
          fVar173 = auVar129._16_4_ + auVar84._16_4_;
          fVar174 = auVar129._20_4_ + auVar84._20_4_;
          fVar175 = auVar129._24_4_ + auVar84._24_4_;
          auVar16 = vsubps_avx(auVar18,auVar19);
          fVar70 = auVar18._0_4_ + auVar19._0_4_;
          fVar71 = auVar18._4_4_ + auVar19._4_4_;
          fVar144 = auVar18._8_4_ + auVar19._8_4_;
          fVar148 = auVar18._12_4_ + auVar19._12_4_;
          fVar149 = auVar18._16_4_ + auVar19._16_4_;
          fVar150 = auVar18._20_4_ + auVar19._20_4_;
          fVar151 = auVar18._24_4_ + auVar19._24_4_;
          fVar118 = auVar16._0_4_;
          fVar122 = auVar16._4_4_;
          auVar18._4_4_ = fVar122 * fVar153;
          auVar18._0_4_ = fVar118 * fVar152;
          fVar123 = auVar16._8_4_;
          auVar18._8_4_ = fVar123 * fVar169;
          fVar124 = auVar16._12_4_;
          auVar18._12_4_ = fVar124 * fVar172;
          fVar125 = auVar16._16_4_;
          auVar18._16_4_ = fVar125 * fVar173;
          fVar126 = auVar16._20_4_;
          auVar18._20_4_ = fVar126 * fVar174;
          fVar127 = auVar16._24_4_;
          auVar18._24_4_ = fVar127 * fVar175;
          auVar18._28_4_ = fVar66;
          fVar178 = auVar133._0_4_;
          fVar181 = auVar133._4_4_;
          auVar28._4_4_ = fVar181 * fVar71;
          auVar28._0_4_ = fVar178 * fVar70;
          fVar182 = auVar133._8_4_;
          auVar28._8_4_ = fVar182 * fVar144;
          fVar183 = auVar133._12_4_;
          auVar28._12_4_ = fVar183 * fVar148;
          fVar184 = auVar133._16_4_;
          auVar28._16_4_ = fVar184 * fVar149;
          fVar185 = auVar133._20_4_;
          auVar28._20_4_ = fVar185 * fVar150;
          fVar186 = auVar133._24_4_;
          auVar28._24_4_ = fVar186 * fVar151;
          auVar28._28_4_ = fVar67;
          auVar133 = vsubps_avx(auVar28,auVar18);
          fVar63 = auVar15._0_4_;
          fVar69 = auVar15._4_4_;
          auVar29._4_4_ = fVar69 * fVar71;
          auVar29._0_4_ = fVar63 * fVar70;
          fVar70 = auVar15._8_4_;
          auVar29._8_4_ = fVar70 * fVar144;
          fVar71 = auVar15._12_4_;
          auVar29._12_4_ = fVar71 * fVar148;
          fVar144 = auVar15._16_4_;
          auVar29._16_4_ = fVar144 * fVar149;
          fVar148 = auVar15._20_4_;
          auVar29._20_4_ = fVar148 * fVar150;
          fVar149 = auVar15._24_4_;
          auVar29._24_4_ = fVar149 * fVar151;
          auVar29._28_4_ = fVar67 + auVar19._28_4_;
          auVar19._4_4_ = fVar122 * fVar177;
          auVar19._0_4_ = fVar118 * fVar176;
          auVar19._8_4_ = fVar123 * fVar113;
          auVar19._12_4_ = fVar124 * fVar114;
          auVar19._16_4_ = fVar125 * fVar115;
          auVar19._20_4_ = fVar126 * fVar116;
          auVar19._24_4_ = fVar127 * fVar117;
          auVar19._28_4_ = fVar67;
          auVar129 = vsubps_avx(auVar19,auVar29);
          auVar30._4_4_ = fVar181 * fVar177;
          auVar30._0_4_ = fVar178 * fVar176;
          auVar30._8_4_ = fVar182 * fVar113;
          auVar30._12_4_ = fVar183 * fVar114;
          auVar30._16_4_ = fVar184 * fVar115;
          auVar30._20_4_ = fVar185 * fVar116;
          auVar30._24_4_ = fVar186 * fVar117;
          auVar30._28_4_ = fVar68 + auVar64._28_4_;
          auVar31._4_4_ = fVar69 * fVar153;
          auVar31._0_4_ = fVar63 * fVar152;
          auVar31._8_4_ = fVar70 * fVar169;
          auVar31._12_4_ = fVar71 * fVar172;
          auVar31._16_4_ = fVar144 * fVar173;
          auVar31._20_4_ = fVar148 * fVar174;
          auVar31._24_4_ = fVar149 * fVar175;
          auVar31._28_4_ = fVar66 + auVar84._28_4_;
          auVar64 = vsubps_avx(auVar31,auVar30);
          fStack_97c = local_980;
          fStack_978 = local_980;
          fStack_974 = local_980;
          fStack_970 = local_980;
          fStack_96c = local_980;
          fStack_968 = local_980;
          fStack_964 = local_980;
          fStack_9bc = local_9c0;
          fStack_9b8 = local_9c0;
          fStack_9b4 = local_9c0;
          fStack_9b0 = local_9c0;
          fStack_9ac = local_9c0;
          fStack_9a8 = local_9c0;
          fStack_9a4 = local_9c0;
          auVar75._0_4_ =
               fVar62 * auVar133._0_4_ + local_9c0 * auVar129._0_4_ + local_980 * auVar64._0_4_;
          auVar75._4_4_ =
               fVar62 * auVar133._4_4_ + local_9c0 * auVar129._4_4_ + local_980 * auVar64._4_4_;
          auVar75._8_4_ =
               fVar62 * auVar133._8_4_ + local_9c0 * auVar129._8_4_ + local_980 * auVar64._8_4_;
          auVar75._12_4_ =
               fVar62 * auVar133._12_4_ + local_9c0 * auVar129._12_4_ + local_980 * auVar64._12_4_;
          auVar75._16_4_ =
               fVar62 * auVar133._16_4_ + local_9c0 * auVar129._16_4_ + local_980 * auVar64._16_4_;
          auVar75._20_4_ =
               fVar62 * auVar133._20_4_ + local_9c0 * auVar129._20_4_ + local_980 * auVar64._20_4_;
          auVar75._24_4_ =
               fVar62 * auVar133._24_4_ + local_9c0 * auVar129._24_4_ + local_980 * auVar64._24_4_;
          auVar75._28_4_ = auVar133._28_4_ + auVar129._28_4_ + auVar64._28_4_;
          fVar66 = auVar75._0_4_ + local_ba0 + fVar155;
          fVar68 = auVar75._4_4_ + fStack_b9c + fVar163;
          auVar82._0_8_ = CONCAT44(fVar68,fVar66);
          auVar82._8_4_ = auVar75._8_4_ + fStack_b98 + auVar156._8_4_;
          auVar82._12_4_ = auVar75._12_4_ + fStack_b94 + auVar156._12_4_;
          auVar83._16_4_ = auVar75._16_4_ + fStack_b90 + auVar157._16_4_;
          auVar83._0_16_ = auVar82;
          auVar83._20_4_ = auVar75._20_4_ + fStack_b8c + auVar157._20_4_;
          auVar85._24_4_ = auVar75._24_4_ + fStack_b88 + auVar159._24_4_;
          auVar85._0_24_ = auVar83;
          auVar85._28_4_ = auVar75._28_4_ + fStack_b84 + auVar159._28_4_;
          auVar133 = vminps_avx(auVar49,auVar159);
          auVar133 = vminps_avx(auVar133,auVar75);
          auVar135._8_4_ = 0x7fffffff;
          auVar135._0_8_ = 0x7fffffff7fffffff;
          auVar135._12_4_ = 0x7fffffff;
          auVar135._16_4_ = 0x7fffffff;
          auVar135._20_4_ = 0x7fffffff;
          auVar135._24_4_ = 0x7fffffff;
          auVar135._28_4_ = 0x7fffffff;
          local_aa0 = auVar85;
          auVar18 = local_aa0;
          local_a00 = vandps_avx(auVar135,auVar85);
          fVar67 = local_a00._0_4_ * 1.1920929e-07;
          fVar150 = local_a00._4_4_ * 1.1920929e-07;
          auVar32._4_4_ = fVar150;
          auVar32._0_4_ = fVar67;
          fVar151 = local_a00._8_4_ * 1.1920929e-07;
          auVar32._8_4_ = fVar151;
          fVar152 = local_a00._12_4_ * 1.1920929e-07;
          auVar32._12_4_ = fVar152;
          fVar153 = local_a00._16_4_ * 1.1920929e-07;
          auVar32._16_4_ = fVar153;
          fVar169 = local_a00._20_4_ * 1.1920929e-07;
          auVar32._20_4_ = fVar169;
          fVar172 = local_a00._24_4_ * 1.1920929e-07;
          auVar32._24_4_ = fVar172;
          auVar32._28_4_ = 0x34000000;
          auVar106._0_8_ = CONCAT44(fVar150,fVar67) ^ 0x8000000080000000;
          auVar106._8_4_ = -fVar151;
          auVar106._12_4_ = -fVar152;
          auVar106._16_4_ = -fVar153;
          auVar106._20_4_ = -fVar169;
          auVar106._24_4_ = -fVar172;
          auVar106._28_4_ = 0xb4000000;
          auVar133 = vcmpps_avx(auVar133,auVar106,5);
          local_c20 = auVar159;
          auVar84 = local_c20;
          auVar129 = vmaxps_avx(auVar49,auVar159);
          auVar64 = vmaxps_avx(auVar129,auVar75);
          auVar64 = vcmpps_avx(auVar64,auVar32,2);
          local_9e0 = vorps_avx(auVar133,auVar64);
          local_c50 = (undefined1 (*) [16])(uVar56 * 0xc + lVar54 + -4);
          auVar133 = local_a20 & local_9e0;
          if ((((((((auVar133 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar133 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar133 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar133 >> 0x7f,0) == '\0') &&
                (auVar133 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar133 >> 0xbf,0) == '\0') &&
              (auVar133 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar133[0x1f]) {
LAB_00b80b66:
            auVar131 = ZEXT1664(local_af0);
            auVar137 = ZEXT1664(local_b00);
            auVar147 = ZEXT1664(local_b10);
            auVar161 = ZEXT1664(local_b20);
            auVar171 = ZEXT1664(local_b30);
            auVar96 = ZEXT1664(local_b40);
            auVar180 = ZEXT1664(local_c60);
            auVar188 = ZEXT1664(local_c70);
            auVar87 = ZEXT1664(local_b50);
            auVar112 = ZEXT1664(local_b60);
            auVar121 = ZEXT1664(local_b70);
          }
          else {
            auVar33._4_4_ = fVar189 * fVar97;
            auVar33._0_4_ = fVar187 * fVar93;
            auVar33._8_4_ = fVar190 * fVar98;
            auVar33._12_4_ = fVar191 * fVar99;
            auVar33._16_4_ = fVar192 * fVar100;
            auVar33._20_4_ = fVar193 * fVar101;
            auVar33._24_4_ = fVar194 * fVar102;
            auVar33._28_4_ = local_9e0._28_4_;
            auVar34._4_4_ = fVar211 * fVar162;
            auVar34._0_4_ = fVar210 * fVar154;
            auVar34._8_4_ = fVar212 * fVar164;
            auVar34._12_4_ = fVar213 * fVar165;
            auVar34._16_4_ = fVar214 * fVar166;
            auVar34._20_4_ = fVar215 * fVar167;
            auVar34._24_4_ = fVar216 * fVar168;
            auVar34._28_4_ = local_a20._28_4_;
            auVar19 = vsubps_avx(auVar34,auVar33);
            auVar35._4_4_ = fVar211 * fVar181;
            auVar35._0_4_ = fVar210 * fVar178;
            auVar35._8_4_ = fVar212 * fVar182;
            auVar35._12_4_ = fVar213 * fVar183;
            auVar35._16_4_ = fVar214 * fVar184;
            auVar35._20_4_ = fVar215 * fVar185;
            auVar35._24_4_ = fVar216 * fVar186;
            auVar35._28_4_ = 0x34000000;
            auVar36._4_4_ = fVar189 * fVar122;
            auVar36._0_4_ = fVar187 * fVar118;
            auVar36._8_4_ = fVar190 * fVar123;
            auVar36._12_4_ = fVar191 * fVar124;
            auVar36._16_4_ = fVar192 * fVar125;
            auVar36._20_4_ = fVar193 * fVar126;
            auVar36._24_4_ = fVar194 * fVar127;
            auVar36._28_4_ = auVar129._28_4_;
            auVar129 = vsubps_avx(auVar36,auVar35);
            auVar133 = vandps_avx(auVar135,auVar33);
            auVar64 = vandps_avx(auVar135,auVar35);
            auVar133 = vcmpps_avx(auVar133,auVar64,1);
            local_860 = vblendvps_avx(auVar129,auVar19,auVar133);
            auVar37._4_4_ = fVar199 * fVar122;
            auVar37._0_4_ = fVar196 * fVar118;
            auVar37._8_4_ = fVar201 * fVar123;
            auVar37._12_4_ = fVar203 * fVar124;
            auVar37._16_4_ = fVar205 * fVar125;
            auVar37._20_4_ = fVar207 * fVar126;
            auVar37._24_4_ = fVar209 * fVar127;
            auVar37._28_4_ = auVar19._28_4_;
            auVar38._4_4_ = fVar199 * fVar97;
            auVar38._0_4_ = fVar196 * fVar93;
            auVar38._8_4_ = fVar201 * fVar98;
            auVar38._12_4_ = fVar203 * fVar99;
            auVar38._16_4_ = fVar205 * fVar100;
            auVar38._20_4_ = fVar207 * fVar101;
            auVar38._24_4_ = fVar209 * fVar102;
            auVar38._28_4_ = auVar64._28_4_;
            auVar39._4_4_ = fVar138 * fVar211;
            auVar39._0_4_ = fVar132 * fVar210;
            auVar39._8_4_ = fVar139 * fVar212;
            auVar39._12_4_ = fVar140 * fVar213;
            auVar39._16_4_ = fVar141 * fVar214;
            auVar39._20_4_ = fVar142 * fVar215;
            auVar39._24_4_ = fVar143 * fVar216;
            auVar39._28_4_ = auVar129._28_4_;
            auVar129 = vsubps_avx(auVar38,auVar39);
            auVar40._4_4_ = fVar211 * fVar69;
            auVar40._0_4_ = fVar210 * fVar63;
            auVar40._8_4_ = fVar212 * fVar70;
            auVar40._12_4_ = fVar213 * fVar71;
            auVar40._16_4_ = fVar214 * fVar144;
            auVar40._20_4_ = fVar215 * fVar148;
            auVar40._24_4_ = fVar216 * fVar149;
            auVar40._28_4_ = auVar16._28_4_;
            auVar19 = vsubps_avx(auVar40,auVar37);
            auVar133 = vandps_avx(auVar135,auVar39);
            auVar64 = vandps_avx(auVar135,auVar37);
            auVar133 = vcmpps_avx(auVar133,auVar64,1);
            local_840 = vblendvps_avx(auVar19,auVar129,auVar133);
            auVar41._4_4_ = fVar189 * fVar69;
            auVar41._0_4_ = fVar187 * fVar63;
            auVar41._8_4_ = fVar190 * fVar70;
            auVar41._12_4_ = fVar191 * fVar71;
            auVar41._16_4_ = fVar192 * fVar144;
            auVar41._20_4_ = fVar193 * fVar148;
            auVar41._24_4_ = fVar194 * fVar149;
            auVar41._28_4_ = auVar15._28_4_;
            auVar42._4_4_ = fVar138 * fVar189;
            auVar42._0_4_ = fVar132 * fVar187;
            auVar42._8_4_ = fVar139 * fVar190;
            auVar42._12_4_ = fVar140 * fVar191;
            auVar42._16_4_ = fVar141 * fVar192;
            auVar42._20_4_ = fVar142 * fVar193;
            auVar42._24_4_ = fVar143 * fVar194;
            auVar42._28_4_ = auVar133._28_4_;
            auVar43._4_4_ = fVar199 * fVar162;
            auVar43._0_4_ = fVar196 * fVar154;
            auVar43._8_4_ = fVar201 * fVar164;
            auVar43._12_4_ = fVar203 * fVar165;
            auVar43._16_4_ = fVar205 * fVar166;
            auVar43._20_4_ = fVar207 * fVar167;
            auVar43._24_4_ = fVar209 * fVar168;
            auVar43._28_4_ = auVar129._28_4_;
            auVar44._4_4_ = fVar199 * fVar181;
            auVar44._0_4_ = fVar196 * fVar178;
            auVar44._8_4_ = fVar201 * fVar182;
            auVar44._12_4_ = fVar203 * fVar183;
            auVar44._16_4_ = fVar205 * fVar184;
            auVar44._20_4_ = fVar207 * fVar185;
            auVar44._24_4_ = fVar209 * fVar186;
            auVar44._28_4_ = local_9a0._28_4_;
            auVar129 = vsubps_avx(auVar42,auVar43);
            auVar19 = vsubps_avx(auVar44,auVar41);
            auVar133 = vandps_avx(auVar135,auVar43);
            auVar64 = vandps_avx(auVar135,auVar41);
            auVar64 = vcmpps_avx(auVar133,auVar64,1);
            local_820 = vblendvps_avx(auVar19,auVar129,auVar64);
            fVar63 = auVar133._28_4_;
            fVar67 = fVar62 * local_860._0_4_ +
                     local_840._0_4_ * local_9c0 + local_820._0_4_ * local_980;
            fVar69 = fVar62 * local_860._4_4_ +
                     local_840._4_4_ * local_9c0 + local_820._4_4_ * local_980;
            fVar70 = fVar62 * local_860._8_4_ +
                     local_840._8_4_ * local_9c0 + local_820._8_4_ * local_980;
            fVar71 = fVar62 * local_860._12_4_ +
                     local_840._12_4_ * local_9c0 + local_820._12_4_ * local_980;
            fVar144 = fVar62 * local_860._16_4_ +
                      local_840._16_4_ * local_9c0 + local_820._16_4_ * local_980;
            fVar148 = fVar62 * local_860._20_4_ +
                      local_840._20_4_ * local_9c0 + local_820._20_4_ * local_980;
            fVar62 = fVar62 * local_860._24_4_ +
                     local_840._24_4_ * local_9c0 + local_820._24_4_ * local_980;
            fVar149 = fVar63 + fVar63 + auVar129._28_4_;
            auVar79._0_4_ = fVar67 + fVar67;
            auVar79._4_4_ = fVar69 + fVar69;
            auVar79._8_4_ = fVar70 + fVar70;
            auVar79._12_4_ = fVar71 + fVar71;
            auVar79._16_4_ = fVar144 + fVar144;
            auVar79._20_4_ = fVar148 + fVar148;
            auVar79._24_4_ = fVar62 + fVar62;
            auVar79._28_4_ = fVar149 + fVar149;
            fVar67 = auVar19._28_4_;
            auVar133 = vrcpps_avx(auVar79);
            fVar69 = local_860._0_4_ * fVar6 + local_840._0_4_ * fVar5 + local_820._0_4_ * fVar195;
            fVar70 = local_860._4_4_ * fVar8 + local_840._4_4_ * fVar7 + local_820._4_4_ * fVar198;
            fVar71 = local_860._8_4_ * fVar10 + local_840._8_4_ * fVar9 + local_820._8_4_ * fVar200;
            fVar88 = local_860._12_4_ * fVar89 +
                     local_840._12_4_ * fVar88 + local_820._12_4_ * fVar202;
            fVar89 = local_860._16_4_ * fVar91 +
                     local_840._16_4_ * fVar90 + local_820._16_4_ * fVar204;
            fVar90 = local_860._20_4_ * fVar11 +
                     local_840._20_4_ * fVar92 + local_820._20_4_ * fVar206;
            fVar91 = local_860._24_4_ * fVar13 +
                     local_840._24_4_ * fVar12 + local_820._24_4_ * fVar208;
            fVar92 = fVar67 + fVar67 + fVar63;
            fVar62 = auVar133._0_4_;
            fVar5 = auVar133._4_4_;
            auVar45._4_4_ = auVar79._4_4_ * fVar5;
            auVar45._0_4_ = auVar79._0_4_ * fVar62;
            fVar6 = auVar133._8_4_;
            auVar45._8_4_ = auVar79._8_4_ * fVar6;
            fVar7 = auVar133._12_4_;
            auVar45._12_4_ = auVar79._12_4_ * fVar7;
            fVar8 = auVar133._16_4_;
            auVar45._16_4_ = auVar79._16_4_ * fVar8;
            fVar9 = auVar133._20_4_;
            auVar45._20_4_ = auVar79._20_4_ * fVar9;
            fVar10 = auVar133._24_4_;
            auVar45._24_4_ = auVar79._24_4_ * fVar10;
            auVar45._28_4_ = fVar67;
            auVar119._8_4_ = 0x3f800000;
            auVar119._0_8_ = 0x3f8000003f800000;
            auVar119._12_4_ = 0x3f800000;
            auVar119._16_4_ = 0x3f800000;
            auVar119._20_4_ = 0x3f800000;
            auVar119._24_4_ = 0x3f800000;
            auVar119._28_4_ = 0x3f800000;
            auVar133 = vsubps_avx(auVar119,auVar45);
            uVar51 = *(undefined4 *)((long)&(local_c78->org).field_0 + 0xc);
            auVar107._4_4_ = uVar51;
            auVar107._0_4_ = uVar51;
            auVar107._8_4_ = uVar51;
            auVar107._12_4_ = uVar51;
            auVar107._16_4_ = uVar51;
            auVar107._20_4_ = uVar51;
            auVar107._24_4_ = uVar51;
            auVar107._28_4_ = uVar51;
            local_880._4_4_ = (fVar70 + fVar70) * (fVar5 + fVar5 * auVar133._4_4_);
            local_880._0_4_ = (fVar69 + fVar69) * (fVar62 + fVar62 * auVar133._0_4_);
            local_880._8_4_ = (fVar71 + fVar71) * (fVar6 + fVar6 * auVar133._8_4_);
            local_880._12_4_ = (fVar88 + fVar88) * (fVar7 + fVar7 * auVar133._12_4_);
            local_880._16_4_ = (fVar89 + fVar89) * (fVar8 + fVar8 * auVar133._16_4_);
            local_880._20_4_ = (fVar90 + fVar90) * (fVar9 + fVar9 * auVar133._20_4_);
            local_880._24_4_ = (fVar91 + fVar91) * (fVar10 + fVar10 * auVar133._24_4_);
            local_880._28_4_ = fVar92 + fVar92;
            auVar133 = vcmpps_avx(auVar107,local_880,2);
            fVar62 = local_c78->tfar;
            auVar108._4_4_ = fVar62;
            auVar108._0_4_ = fVar62;
            auVar108._8_4_ = fVar62;
            auVar108._12_4_ = fVar62;
            auVar108._16_4_ = fVar62;
            auVar108._20_4_ = fVar62;
            auVar108._24_4_ = fVar62;
            auVar108._28_4_ = fVar62;
            auVar64 = vcmpps_avx(local_880,auVar108,2);
            auVar133 = vandps_avx(auVar133,auVar64);
            auVar64 = vcmpps_avx(auVar79,_DAT_01f7b000,4);
            auVar133 = vandps_avx(auVar64,auVar133);
            auVar94 = vpslld_avx(auVar133._0_16_,0x1f);
            auVar95 = vpsrad_avx(auVar94,0x1f);
            auVar94 = vpslld_avx(auVar133._16_16_,0x1f);
            auVar94 = vpsrad_avx(auVar94,0x1f);
            auVar80._16_16_ = auVar94;
            auVar80._0_16_ = auVar95;
            auVar133 = vandps_avx(local_a20,local_9e0);
            auVar64 = auVar133 & auVar80;
            if ((((((((auVar64 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar64 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar64 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar64 >> 0x7f,0) == '\0') &&
                  (auVar64 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar64 >> 0xbf,0) == '\0') &&
                (auVar64 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar64[0x1f]) goto LAB_00b80b66;
            uVar56 = CONCAT44(0,*(uint *)(uVar55 + 0x18));
            auVar2._0_4_ = local_c78->tfar;
            auVar2._4_4_ = local_c78->mask;
            auVar2._8_4_ = local_c78->id;
            auVar2._12_4_ = local_c78->flags;
            local_8e0 = vandps_avx(auVar80,auVar133);
            uVar50 = vextractps_avx(auVar2,1);
            local_960 = CONCAT44(fStack_b9c,local_ba0);
            uStack_958 = CONCAT44(fStack_b94,fStack_b98);
            uStack_950 = CONCAT44(fStack_b8c,fStack_b90);
            uStack_948 = CONCAT44(fStack_b84,fStack_b88);
            local_c20._8_8_ = auVar156._8_8_;
            local_c20._16_8_ = auVar157._16_8_;
            local_c20._24_8_ = auVar159._24_8_;
            local_940 = auVar156._0_8_;
            uStack_938 = local_c20._8_8_;
            uStack_930 = local_c20._16_8_;
            uStack_928 = local_c20._24_8_;
            local_aa0._8_8_ = auVar82._8_8_;
            local_aa0._16_8_ = auVar83._16_8_;
            local_aa0._24_8_ = auVar85._24_8_;
            local_920 = auVar82._0_8_;
            uStack_918 = local_aa0._8_8_;
            uStack_910 = local_aa0._16_8_;
            uStack_908 = local_aa0._24_8_;
            local_900 = &local_c50;
            pGVar4 = (local_c30->scene->geometries).items[uVar56].ptr;
            if ((pGVar4->mask & uVar50) == 0) goto LAB_00b80b66;
            if ((local_c30->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_00b80ca8:
              local_c78->tfar = -INFINITY;
              return;
            }
            local_ac0._0_8_ = local_c30->args;
            local_ae0._0_8_ = pGVar4;
            auVar94 = *(undefined1 (*) [16])(*local_c50 + local_c48 * 4);
            auVar95 = auVar94;
            if (2 < local_c40) {
              auVar95 = *(undefined1 (*) [16])(*local_c50 + local_c48 * 8);
            }
            local_a80._0_16_ = auVar2;
            auVar133 = vrcpps_avx(auVar85);
            fVar62 = auVar133._0_4_;
            fVar5 = auVar133._4_4_;
            auVar46._4_4_ = fVar68 * fVar5;
            auVar46._0_4_ = fVar66 * fVar62;
            fVar6 = auVar133._8_4_;
            auVar46._8_4_ = auVar82._8_4_ * fVar6;
            fVar7 = auVar133._12_4_;
            auVar46._12_4_ = auVar82._12_4_ * fVar7;
            fVar8 = auVar133._16_4_;
            auVar46._16_4_ = auVar83._16_4_ * fVar8;
            fVar9 = auVar133._20_4_;
            auVar46._20_4_ = auVar83._20_4_ * fVar9;
            fVar10 = auVar133._24_4_;
            auVar46._24_4_ = auVar85._24_4_ * fVar10;
            auVar46._28_4_ = auVar85._28_4_;
            auVar109._8_4_ = 0x3f800000;
            auVar109._0_8_ = 0x3f8000003f800000;
            auVar109._12_4_ = 0x3f800000;
            auVar109._16_4_ = 0x3f800000;
            auVar109._20_4_ = 0x3f800000;
            auVar109._24_4_ = 0x3f800000;
            auVar109._28_4_ = 0x3f800000;
            auVar64 = vsubps_avx(auVar109,auVar46);
            auVar65._0_4_ = fVar62 + fVar62 * auVar64._0_4_;
            auVar65._4_4_ = fVar5 + fVar5 * auVar64._4_4_;
            auVar65._8_4_ = fVar6 + fVar6 * auVar64._8_4_;
            auVar65._12_4_ = fVar7 + fVar7 * auVar64._12_4_;
            auVar65._16_4_ = fVar8 + fVar8 * auVar64._16_4_;
            auVar65._20_4_ = fVar9 + fVar9 * auVar64._20_4_;
            auVar65._24_4_ = fVar10 + fVar10 * auVar64._24_4_;
            auVar65._28_4_ = auVar133._28_4_ + auVar64._28_4_;
            auVar76._8_4_ = 0x219392ef;
            auVar76._0_8_ = 0x219392ef219392ef;
            auVar76._12_4_ = 0x219392ef;
            auVar76._16_4_ = 0x219392ef;
            auVar76._20_4_ = 0x219392ef;
            auVar76._24_4_ = 0x219392ef;
            auVar76._28_4_ = 0x219392ef;
            auVar133 = vcmpps_avx(local_a00,auVar76,5);
            auVar133 = vandps_avx(auVar133,auVar65);
            auVar47._4_4_ = auVar133._4_4_ * fStack_b9c;
            auVar47._0_4_ = auVar133._0_4_ * local_ba0;
            auVar47._8_4_ = auVar133._8_4_ * fStack_b98;
            auVar47._12_4_ = auVar133._12_4_ * fStack_b94;
            auVar47._16_4_ = auVar133._16_4_ * fStack_b90;
            auVar47._20_4_ = auVar133._20_4_ * fStack_b8c;
            auVar47._24_4_ = auVar133._24_4_ * fStack_b88;
            auVar47._28_4_ = auVar65._28_4_;
            auVar64 = vminps_avx(auVar47,auVar109);
            auVar48._4_4_ = auVar133._4_4_ * fVar163;
            auVar48._0_4_ = auVar133._0_4_ * fVar155;
            auVar48._8_4_ = auVar133._8_4_ * auVar156._8_4_;
            auVar48._12_4_ = auVar133._12_4_ * auVar156._12_4_;
            auVar48._16_4_ = auVar133._16_4_ * auVar157._16_4_;
            auVar48._20_4_ = auVar133._20_4_ * auVar157._20_4_;
            auVar48._24_4_ = auVar133._24_4_ * auVar159._24_4_;
            auVar48._28_4_ = auVar133._28_4_;
            auVar133 = vminps_avx(auVar48,auVar109);
            auVar128 = *local_c50;
            if (local_c48 == 2) {
              auVar128 = vpshufd_avx(auVar128,0x54);
              auVar94 = vpshufd_avx(auVar94,0x54);
              auVar95 = vpshufd_avx(auVar95,0x54);
            }
            auVar120._16_16_ = auVar94;
            auVar120._0_16_ = auVar128;
            auVar130._16_16_ = auVar95;
            auVar130._0_16_ = auVar94;
            auVar129 = vunpcklps_avx(auVar120,auVar130);
            auVar128 = vpshufd_avx(auVar128,0xa5);
            auVar81 = vpshufd_avx(auVar94,0xa5);
            auVar136._16_16_ = auVar81;
            auVar136._0_16_ = auVar128;
            auVar94 = vpshufd_avx(auVar94,0x94);
            auVar95 = vpshufd_avx(auVar95,0x94);
            auVar146._16_16_ = auVar95;
            auVar146._0_16_ = auVar94;
            auVar160._0_16_ = vpsrld_avx(auVar129._0_16_,0x10);
            auVar170 = vpsrld_avx(auVar129._16_16_,0x10);
            auVar197._8_4_ = 0xffff;
            auVar197._0_8_ = 0xffff0000ffff;
            auVar197._12_4_ = 0xffff;
            auVar197._16_4_ = 0xffff;
            auVar197._20_4_ = 0xffff;
            auVar197._24_4_ = 0xffff;
            auVar197._28_4_ = 0xffff;
            auVar129 = vandps_avx(auVar197,auVar129);
            auVar19 = vcvtdq2ps_avx(auVar129);
            auVar160._16_16_ = auVar170;
            auVar15 = vcvtdq2ps_avx(auVar160);
            auVar110._0_16_ = vpsrld_avx(auVar128,0x10);
            auVar128 = vpsrld_avx(auVar81,0x10);
            auVar129 = vandps_avx(auVar136,auVar197);
            auVar16 = vcvtdq2ps_avx(auVar129);
            auVar110._16_16_ = auVar128;
            auVar20 = vcvtdq2ps_avx(auVar110);
            auVar86._0_16_ = vpsrld_avx(auVar94,0x10);
            auVar94 = vpsrld_avx(auVar95,0x10);
            auVar129 = vandps_avx(auVar146,auVar197);
            auVar129 = vcvtdq2ps_avx(auVar129);
            auVar86._16_16_ = auVar94;
            auVar14 = vcvtdq2ps_avx(auVar86);
            auVar111._8_4_ = 0x3f800000;
            auVar111._0_8_ = 0x3f8000003f800000;
            auVar111._12_4_ = 0x3f800000;
            auVar111._16_4_ = 0x3f800000;
            auVar111._20_4_ = 0x3f800000;
            auVar111._24_4_ = 0x3f800000;
            auVar111._28_4_ = 0x3f800000;
            auVar17 = vsubps_avx(auVar111,auVar64);
            auVar17 = vsubps_avx(auVar17,auVar133);
            local_8c0._0_4_ =
                 auVar133._0_4_ * auVar129._0_4_ * 0.00012207031 +
                 auVar16._0_4_ * 0.00012207031 * auVar64._0_4_ +
                 auVar17._0_4_ * auVar19._0_4_ * 0.00012207031;
            local_8c0._4_4_ =
                 auVar133._4_4_ * auVar129._4_4_ * 0.00012207031 +
                 auVar16._4_4_ * 0.00012207031 * auVar64._4_4_ +
                 auVar17._4_4_ * auVar19._4_4_ * 0.00012207031;
            local_8c0._8_4_ =
                 auVar133._8_4_ * auVar129._8_4_ * 0.00012207031 +
                 auVar16._8_4_ * 0.00012207031 * auVar64._8_4_ +
                 auVar17._8_4_ * auVar19._8_4_ * 0.00012207031;
            local_8c0._12_4_ =
                 auVar133._12_4_ * auVar129._12_4_ * 0.00012207031 +
                 auVar16._12_4_ * 0.00012207031 * auVar64._12_4_ +
                 auVar17._12_4_ * auVar19._12_4_ * 0.00012207031;
            local_8c0._16_4_ =
                 auVar133._16_4_ * auVar129._16_4_ * 0.00012207031 +
                 auVar16._16_4_ * 0.00012207031 * auVar64._16_4_ +
                 auVar17._16_4_ * auVar19._16_4_ * 0.00012207031;
            local_8c0._20_4_ =
                 auVar133._20_4_ * auVar129._20_4_ * 0.00012207031 +
                 auVar16._20_4_ * 0.00012207031 * auVar64._20_4_ +
                 auVar17._20_4_ * auVar19._20_4_ * 0.00012207031;
            local_8c0._24_4_ =
                 auVar133._24_4_ * auVar129._24_4_ * 0.00012207031 +
                 auVar16._24_4_ * 0.00012207031 * auVar64._24_4_ +
                 auVar17._24_4_ * auVar19._24_4_ * 0.00012207031;
            local_8c0._28_4_ = auVar129._28_4_ + 0.0 + auVar133._28_4_;
            local_8a0._0_4_ =
                 auVar133._0_4_ * auVar14._0_4_ * 0.00012207031 +
                 auVar64._0_4_ * auVar20._0_4_ * 0.00012207031 +
                 auVar15._0_4_ * 0.00012207031 * auVar17._0_4_;
            local_8a0._4_4_ =
                 auVar133._4_4_ * auVar14._4_4_ * 0.00012207031 +
                 auVar64._4_4_ * auVar20._4_4_ * 0.00012207031 +
                 auVar15._4_4_ * 0.00012207031 * auVar17._4_4_;
            local_8a0._8_4_ =
                 auVar133._8_4_ * auVar14._8_4_ * 0.00012207031 +
                 auVar64._8_4_ * auVar20._8_4_ * 0.00012207031 +
                 auVar15._8_4_ * 0.00012207031 * auVar17._8_4_;
            local_8a0._12_4_ =
                 auVar133._12_4_ * auVar14._12_4_ * 0.00012207031 +
                 auVar64._12_4_ * auVar20._12_4_ * 0.00012207031 +
                 auVar15._12_4_ * 0.00012207031 * auVar17._12_4_;
            local_8a0._16_4_ =
                 auVar133._16_4_ * auVar14._16_4_ * 0.00012207031 +
                 auVar64._16_4_ * auVar20._16_4_ * 0.00012207031 +
                 auVar15._16_4_ * 0.00012207031 * auVar17._16_4_;
            local_8a0._20_4_ =
                 auVar133._20_4_ * auVar14._20_4_ * 0.00012207031 +
                 auVar64._20_4_ * auVar20._20_4_ * 0.00012207031 +
                 auVar15._20_4_ * 0.00012207031 * auVar17._20_4_;
            local_8a0._24_4_ =
                 auVar133._24_4_ * auVar14._24_4_ * 0.00012207031 +
                 auVar64._24_4_ * auVar20._24_4_ * 0.00012207031 +
                 auVar15._24_4_ * 0.00012207031 * auVar17._24_4_;
            local_8a0._28_4_ = auVar14._28_4_ + auVar20._28_4_ + auVar17._28_4_;
            uVar51 = vmovmskps_avx(local_8e0);
            uVar52 = CONCAT44((int)((ulong)local_c50 >> 0x20),uVar51);
            lVar54 = 0;
            if (uVar52 != 0) {
              for (; (uVar52 >> lVar54 & 1) == 0; lVar54 = lVar54 + 1) {
              }
            }
            local_a40._0_8_ = uVar56;
            local_a60._0_4_ = *(undefined4 *)(uVar55 + 0x1c);
            local_bec = *(undefined4 *)(uVar55 + 0x1c);
            local_c20 = auVar84;
            local_aa0 = auVar18;
            local_9a0 = auVar105;
            while( true ) {
              auVar188 = ZEXT1664(local_c70);
              auVar180 = ZEXT1664(local_c60);
              if (uVar52 == 0) break;
              local_ba0 = (float)uVar52;
              fStack_b9c = (float)(uVar52 >> 0x20);
              local_bf4 = *(undefined4 *)(local_8c0 + lVar54 * 4);
              local_bf0 = *(undefined4 *)(local_8a0 + lVar54 * 4);
              local_c78->tfar = *(float *)(local_880 + lVar54 * 4);
              local_bc0 = local_c30->user;
              local_c00 = *(undefined4 *)(local_860 + lVar54 * 4);
              local_bfc = *(undefined4 *)(local_840 + lVar54 * 4);
              local_c20._0_8_ = lVar54;
              local_bf8 = *(undefined4 *)(local_820 + lVar54 * 4);
              local_be8 = (undefined4)uVar56;
              local_be4 = local_bc0->instID[0];
              local_be0 = local_bc0->instPrimID[0];
              local_c7c = -1;
              local_bd0 = &local_c7c;
              local_bc8 = *(undefined8 *)(local_ae0._0_8_ + 0x18);
              local_bb0 = &local_c00;
              local_ba8 = 1;
              local_bb8 = local_c78;
              if ((*(code **)(local_ae0._0_8_ + 0x48) == (code *)0x0) ||
                 ((**(code **)(local_ae0._0_8_ + 0x48))(&local_bd0), *local_bd0 != 0)) {
                if ((*(code **)(local_ac0._0_8_ + 0x10) == (code *)0x0) ||
                   ((((*(byte *)local_ac0._0_8_ & 2) == 0 &&
                     ((*(byte *)(local_ae0._0_8_ + 0x3e) & 0x40) == 0)) ||
                    ((**(code **)(local_ac0._0_8_ + 0x10))(&local_bd0), *local_bd0 != 0))))
                goto LAB_00b80ca8;
              }
              local_c78->tfar = local_a80._0_4_;
              uVar52 = CONCAT44(fStack_b9c,local_ba0) ^ 1L << (local_c20._0_8_ & 0x3f);
              lVar54 = 0;
              if (uVar52 != 0) {
                for (; (uVar52 >> lVar54 & 1) == 0; lVar54 = lVar54 + 1) {
                }
              }
              uVar56 = local_a40._0_8_;
              local_bec = local_a60._0_4_;
            }
            auVar131 = ZEXT1664(local_af0);
            auVar137 = ZEXT1664(local_b00);
            auVar147 = ZEXT1664(local_b10);
            auVar161 = ZEXT1664(local_b20);
            auVar171 = ZEXT1664(local_b30);
            auVar96 = ZEXT1664(local_b40);
            auVar87 = ZEXT1664(local_b50);
            auVar112 = ZEXT1664(local_b60);
            auVar121 = ZEXT1664(local_b70);
          }
          goto LAB_00b80109;
        }
        uVar55 = uVar56 & 0xfffffffffffffff0;
        uVar56 = *(ulong *)(uVar55 + 0x30 + (ulong)*(uint *)(uVar55 + 0x2c));
        if (uVar56 != 0) {
          *local_c38 = uVar56;
          local_c38 = local_c38 + 1;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }